

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O1

pint p_shm_buffer_read(PShmBuffer *buf,ppointer storage,psize len,PError **error)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  pboolean pVar4;
  ulong *puVar5;
  psize pVar6;
  char *message;
  ulong uVar7;
  size_t sVar8;
  
  if (((buf == (PShmBuffer *)0x0) || (storage == (ppointer)0x0)) || (len == 0)) {
    message = "Invalid input argument";
  }
  else {
    puVar5 = (ulong *)p_shm_get_address(buf->shm);
    if (puVar5 != (ulong *)0x0) {
      pVar4 = p_shm_lock(buf->shm,error);
      if (pVar4 == 0) {
        return -1;
      }
      uVar2 = *puVar5;
      if (uVar2 != puVar5[1]) {
        pVar6 = pp_shm_buffer_get_used_space(buf);
        if (pVar6 < len) {
          len = pVar6;
        }
        uVar3 = buf->size;
        uVar7 = uVar2 % uVar3;
        if (uVar3 < uVar7 + len) {
          sVar8 = uVar3 - uVar7;
          memcpy(storage,(void *)((long)puVar5 + uVar7 + 0x10),sVar8);
          storage = (ppointer)((long)storage + sVar8);
          sVar8 = len - sVar8;
          puVar1 = puVar5;
        }
        else {
          puVar1 = (ulong *)((long)puVar5 + uVar7);
          sVar8 = len;
        }
        memcpy(storage,puVar1 + 2,sVar8);
        *puVar5 = (uVar2 + len) % buf->size;
        pVar4 = p_shm_unlock(buf->shm,error);
        return -(uint)(pVar4 == 0) | (uint)len;
      }
      pVar4 = p_shm_unlock(buf->shm,error);
      return -(uint)(pVar4 == 0);
    }
    message = "Unable to get shared memory address";
  }
  p_error_set_error_p(error,0x25f,0,message);
  return -1;
}

Assistant:

P_LIB_API pint
p_shm_buffer_read (PShmBuffer	*buf,
		   ppointer	storage,
		   psize	len,
		   PError	**error)
{
	psize		read_pos;
	psize		write_pos;
	psize		data_aval;
	psize		to_copy;
	psize		start_pos;
	ppointer	addr;

	if (P_UNLIKELY (buf == NULL || storage == NULL || len == 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return -1;
	}

	if (P_UNLIKELY ((addr = p_shm_get_address (buf->shm)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Unable to get shared memory address");
		return -1;
	}

	if (P_UNLIKELY (p_shm_lock (buf->shm, error) == FALSE))
		return -1;

	memcpy (&read_pos, (pchar *) addr + P_SHM_BUFFER_READ_OFFSET, sizeof (read_pos));
	memcpy (&write_pos, (pchar *) addr + P_SHM_BUFFER_WRITE_OFFSET, sizeof (write_pos));

	if (read_pos == write_pos) {
		if (P_UNLIKELY (p_shm_unlock (buf->shm, error) == FALSE))
			return -1;

		return 0;
	}

	data_aval = pp_shm_buffer_get_used_space (buf);
	to_copy   = (data_aval <= len) ? data_aval : len;

	start_pos = read_pos % buf->size;

	if (start_pos + to_copy <= buf->size) {
		memcpy ((pchar *) storage, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET + start_pos, to_copy);
	} else {
		psize first_part_size = buf->size - start_pos;

		memcpy ((pchar *) storage, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET + start_pos, first_part_size);
		memcpy ((pchar *) storage + first_part_size, (pchar *) addr + P_SHM_BUFFER_DATA_OFFSET, to_copy - first_part_size);
	}

	read_pos = (read_pos + to_copy) % buf->size;
	memcpy ((pchar *) addr + P_SHM_BUFFER_READ_OFFSET, &read_pos, sizeof (read_pos));

	if (P_UNLIKELY (p_shm_unlock (buf->shm, error) == FALSE))
		return -1;

	return (pint) to_copy;
}